

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<DataStream_&,_TransactionSerParams> *s,
          vector<CTxOut,_std::allocator<CTxOut>_> *v)

{
  pointer pCVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong __nbytes;
  uint64_t __n;
  long in_FS_OFFSET;
  uint64_t obj;
  CAmount local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase_at_end
            (v,(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
               super__Vector_impl_data._M_start);
  uVar2 = ReadCompactSize<ParamsStream<DataStream&,TransactionSerParams>>(s,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar3 = __n + 0x1e848;
      __n = uVar2;
      if (uVar3 < uVar2) {
        __n = uVar3;
      }
      __nbytes = uVar3;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve(v,__n);
      while ((ulong)(((long)(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < __n) {
        std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<>(v);
        pCVar1 = (v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        DataStream::read(s->m_substream,(int)&local_40,&DAT_00000008,__nbytes);
        pCVar1[-1].nValue = local_40;
        Unserialize<ParamsStream<DataStream&,TransactionSerParams>,28u,unsigned_char>
                  (s,&pCVar1[-1].scriptPubKey.super_CScriptBase);
      }
    } while (uVar3 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }